

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.h
# Opt level: O0

void __thiscall IntegerRandomGenerator::~IntegerRandomGenerator(IntegerRandomGenerator *this)

{
  IntegerRandomGenerator *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->mValues);
  std::vector<double,_std::allocator<double>_>::~vector(&this->mDist);
  return;
}

Assistant:

IntegerRandomGenerator(std::vector<double> distribution, std::vector<int> values)
    {
        size_t size_dist = distribution.size();
        size_t size_val  = values.size();
        if( size_dist != size_val )
        {
            throw std::invalid_argument("distribution and values vectors shall have the same length");
        }
        else
        {
            for( double p_i : distribution )
            {
                mDist.push_back(p_i);
            }
            for( int x_i : values )
            {
                mValues.push_back(x_i);
            }
        }
    }